

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_ManSimPatHashPatterns(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int *pnC0,int *pnC1)

{
  ulong uVar1;
  size_t __n;
  word *pwVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *p_01;
  int *piVar8;
  word **__ptr;
  word *pwVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  ulong local_a8;
  
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = nWords;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  uVar18 = 0xfff;
  while( true ) {
    do {
      uVar17 = uVar18;
      uVar18 = uVar17 + 1;
    } while ((uVar17 & 1) != 0);
    if (uVar18 < 9) break;
    iVar10 = 5;
    while (uVar18 % (iVar10 - 2U) != 0) {
      uVar4 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar18 < uVar4) goto LAB_007d27d9;
    }
  }
LAB_007d27d9:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar17) {
    uVar4 = uVar18;
  }
  pVVar6->nCap = uVar4;
  piVar7 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar18;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar18 << 2);
  }
  p_00->vTable = pVVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x1000;
  p_01->nSize = 0;
  piVar8 = (int *)malloc(0x4000);
  p_01->pArray = piVar8;
  p_00->vNexts = p_01;
  if (p->nObjs < 1) {
    __ptr = (word **)0x0;
    local_a8._0_4_ = -1;
    uVar18 = 0;
  }
  else {
    __n = (long)nWords * 8;
    local_a8 = 0xffffffff;
    lVar16 = 0;
    __ptr = (word **)0x0;
    iVar10 = 0;
    uVar14 = 0;
    lVar19 = 0;
    do {
      uVar18 = (uint)uVar14;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar17 = *(uint *)(p->pObjs + lVar19);
      uVar4 = ~uVar17;
      if (((uVar4 & 0x9fffffff) == 0) || (-1 < (int)uVar17 && (uVar4 & 0x1fffffff) != 0)) {
        lVar13 = lVar19 * nWords;
        if ((lVar13 < 0) || (vSims->nSize <= lVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar2 = vSims->pArray;
        if (pnC0 != (int *)0x0) {
          if (0 < nWords) {
            uVar12 = 0;
            do {
              if (*(long *)((long)pwVar2 + uVar12 * 8 + lVar16) != 0) goto LAB_007d2958;
              uVar12 = uVar12 + 1;
            } while ((uint)nWords != uVar12);
          }
          *pnC0 = *pnC0 + 1;
        }
LAB_007d2958:
        if (pnC1 != (int *)0x0) {
          if (0 < nWords) {
            uVar12 = 0;
            do {
              if (*(long *)((long)pwVar2 + uVar12 * 8 + lVar16) != -1) goto LAB_007d2983;
              uVar12 = uVar12 + 1;
            } while ((uint)nWords != uVar12);
          }
          *pnC1 = *pnC1 + 1;
        }
LAB_007d2983:
        if (pVVar6->nSize < (int)uVar18) {
          uVar12 = (ulong)(pVVar6->nSize * 2 - 1);
          while( true ) {
            do {
              uVar17 = (uint)uVar12;
              uVar4 = uVar17 + 1;
              uVar15 = (ulong)uVar4;
              uVar1 = uVar12 & 1;
              uVar12 = uVar15;
            } while (uVar1 != 0);
            if (uVar4 < 9) break;
            iVar11 = 5;
            while (uVar4 % (iVar11 - 2U) != 0) {
              uVar5 = iVar11 * iVar11;
              iVar11 = iVar11 + 2;
              if (uVar4 < uVar5) goto LAB_007d29d3;
            }
          }
LAB_007d29d3:
          if (pVVar6->nCap < (int)uVar4) {
            if (pVVar6->pArray == (int *)0x0) {
              piVar7 = (int *)malloc((long)(int)uVar4 << 2);
            }
            else {
              piVar7 = (int *)realloc(pVVar6->pArray,(long)(int)uVar4 << 2);
            }
            pVVar6->pArray = piVar7;
            if (piVar7 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar6->nCap = uVar4;
          }
          if (uVar17 < 0x7fffffff) {
            memset(pVVar6->pArray,0xff,uVar15 << 2);
          }
          pVVar6->nSize = uVar4;
          p_01->nSize = 0;
          if ((int)uVar18 < 1) {
            uVar17 = 0;
          }
          else {
            pwVar9 = *__ptr;
            if (pwVar9 == (word *)0x0) goto LAB_007d2d3b;
            uVar17 = 1;
            do {
              piVar7 = Vec_MemHashLookup(p_00,pwVar9 + (int)((uVar17 - 1 & 0xfff) * nWords));
              if (*piVar7 != -1) {
                __assert_fail("*pSpot == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                              ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
              }
              *piVar7 = p_01->nSize;
              Vec_IntPush(p_01,-1);
              if (uVar18 == uVar17) break;
              pwVar9 = __ptr[uVar17 >> 0xc];
              uVar17 = uVar17 + 1;
            } while (pwVar9 != (word *)0x0);
            uVar17 = p_01->nSize;
          }
          if (uVar18 != uVar17) {
LAB_007d2d3b:
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
        }
        piVar7 = Vec_MemHashLookup(p_00,pwVar2 + lVar13);
        if (*piVar7 == -1) {
          *piVar7 = p_01->nSize;
          Vec_IntPush(p_01,-1);
          if ((int)uVar18 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
          }
          uVar14 = uVar14 >> 0xc;
          iVar11 = (int)uVar14;
          if ((int)local_a8 < iVar11) {
            if (iVar10 <= iVar11) {
              iVar3 = iVar10 * 2;
              bVar20 = iVar10 != 0;
              iVar10 = iVar11 + 0x20;
              if (bVar20) {
                iVar10 = iVar3;
              }
              p_00->nPageAlloc = iVar10;
              if (__ptr == (word **)0x0) {
                __ptr = (word **)malloc((long)iVar10 * 8);
              }
              else {
                __ptr = (word **)realloc(__ptr,(long)iVar10 * 8);
              }
              p_00->ppPages = __ptr;
            }
            uVar12 = (long)(int)local_a8;
            do {
              uVar1 = uVar12 + 1;
              pwVar9 = (word *)malloc((long)(nWords << 0xc) << 3);
              __ptr[uVar12 + 1] = pwVar9;
              uVar12 = uVar1;
            } while (uVar14 != uVar1);
            p_00->iPage = iVar11;
            __ptr = p_00->ppPages;
            local_a8 = uVar14;
          }
          uVar17 = uVar18 + 1;
          p_00->nEntries = uVar17;
          memmove(__ptr[uVar14] + (int)((uVar18 & 0xfff) * nWords),pwVar2 + lVar13,__n);
          uVar14 = (ulong)uVar17;
          if (uVar17 != p_01->nSize) {
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
          }
        }
      }
      uVar18 = (uint)uVar14;
      lVar19 = lVar19 + 1;
      lVar16 = lVar16 + __n;
    } while (lVar19 < p->nObjs);
    piVar7 = pVVar6->pArray;
  }
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar6);
  p_00->vTable = (Vec_Int_t *)0x0;
  pVVar6 = p_00->vNexts;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    p_00->vNexts = (Vec_Int_t *)0x0;
  }
  if (-1 < (int)local_a8) {
    uVar14 = 0;
    do {
      if (__ptr[uVar14] != (word *)0x0) {
        free(__ptr[uVar14]);
        __ptr[uVar14] = (word *)0x0;
      }
      uVar14 = uVar14 + 1;
    } while ((int)local_a8 + 1 != uVar14);
    __ptr = p_00->ppPages;
  }
  if (__ptr != (word **)0x0) {
    free(__ptr);
  }
  free(p_00);
  return uVar18;
}

Assistant:

int Gia_ManSimPatHashPatterns( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int * pnC0, int * pnC1 )
{
    Gia_Obj_t * pObj; 
    int i, nUnique;
    Vec_Mem_t * vStore;
    vStore = Vec_MemAlloc( nWords, 12 ); // 2^12 N-word entries per page
    Vec_MemHashAlloc( vStore, 1 << 12 );
    Gia_ManForEachCand( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( pnC0 && Abc_TtIsConst0(pSim, nWords) )
            (*pnC0)++;
        if ( pnC1 && Abc_TtIsConst1(pSim, nWords) )
            (*pnC1)++;
        Vec_MemHashInsert( vStore, pSim );
    }
    nUnique = Vec_MemEntryNum( vStore );
    Vec_MemHashFree( vStore );
    Vec_MemFree( vStore );
    return nUnique;
}